

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.c
# Opt level: O0

char * linenoise(char *prompt)

{
  int iVar1;
  char *pcVar2;
  bool bVar3;
  size_t local_1028;
  size_t len;
  char local_1018 [4];
  int count;
  char buf [4096];
  char *prompt_local;
  
  buf._4088_8_ = prompt;
  iVar1 = isUnsupportedTerm();
  if (iVar1 == 0) {
    len._4_4_ = linenoiseRaw(local_1018,0x1000,(char *)buf._4088_8_);
    if (len._4_4_ == -1) {
      prompt_local = (char *)0x0;
    }
    else {
      prompt_local = strdup(local_1018);
    }
  }
  else {
    printf("%s",buf._4088_8_);
    fflush(_stdout);
    pcVar2 = fgets(local_1018,0x1000,_stdin);
    if (pcVar2 == (char *)0x0) {
      prompt_local = (char *)0x0;
    }
    else {
      local_1028 = strlen(local_1018);
      while( true ) {
        bVar3 = false;
        if ((local_1028 != 0) && (bVar3 = true, local_1018[local_1028 - 1] != '\n')) {
          bVar3 = local_1018[local_1028 - 1] == '\r';
        }
        if (!bVar3) break;
        local_1018[local_1028 - 1] = '\0';
        local_1028 = local_1028 - 1;
      }
      prompt_local = strdup(local_1018);
    }
  }
  return prompt_local;
}

Assistant:

char *linenoise(const char *prompt) {
    char buf[LINENOISE_MAX_LINE];
    int count;

    if (isUnsupportedTerm()) {
        size_t len;

        printf("%s",prompt);
        fflush(stdout);
        if (fgets(buf,LINENOISE_MAX_LINE,stdin) == NULL) return NULL;
        len = strlen(buf);
        while(len && (buf[len-1] == '\n' || buf[len-1] == '\r')) {
            len--;
            buf[len] = '\0';
        }
        return strdup(buf);
    } else {
        count = linenoiseRaw(buf,LINENOISE_MAX_LINE,prompt);
        if (count == -1) return NULL;
        return strdup(buf);
    }
}